

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aems.cpp
# Opt level: O2

ValuedAction __thiscall despot::AEMS::Search(AEMS *this)

{
  History *history;
  int *piVar1;
  pointer piVar2;
  pointer piVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  VNode *pVVar7;
  undefined4 extraout_var;
  clock_t cVar8;
  clock_t cVar9;
  clock_t cVar10;
  log_ostream *plVar11;
  ostream *poVar12;
  long lVar13;
  History *history_00;
  History *history_01;
  SearchStatistics *pSVar14;
  SearchStatistics *pSVar15;
  byte bVar16;
  double dVar17;
  double dVar18;
  ValuedAction VVar19;
  SearchStatistics local_90;
  
  bVar16 = 0;
  if (this->root_ == (VNode *)0x0) {
    pVVar7 = (VNode *)operator_new(0x98);
    iVar5 = (*((this->super_Solver).belief_)->_vptr_Belief[5])();
    VNode::VNode(pVVar7,(Belief *)CONCAT44(extraout_var,iVar5),0,(QNode *)0x0,0xffffffffffffffff);
    this->root_ = pVVar7;
    InitLowerBound(pVVar7,this->lower_bound_,history_00);
    InitUpperBound(this->root_,this->upper_bound_,history_01);
  }
  SearchStatistics::SearchStatistics(&local_90);
  pSVar14 = &local_90;
  pSVar15 = &this->statistics_;
  for (lVar13 = 0xc; lVar13 != 0; lVar13 = lVar13 + -1) {
    pSVar15->initial_lb = pSVar14->initial_lb;
    pSVar14 = (SearchStatistics *)((long)pSVar14 + (ulong)bVar16 * -0x10 + 8);
    pSVar15 = (SearchStatistics *)((long)pSVar15 + (ulong)bVar16 * -0x10 + 8);
  }
  iVar5 = (*(this->model_->super_DSPOMDP)._vptr_DSPOMDP[0x18])();
  (this->statistics_).num_particles_before_search = iVar5;
  (*(this->model_->super_DSPOMDP)._vptr_DSPOMDP[0x14])
            (this->model_,(this->super_Solver).belief_,&std::cout);
  cVar8 = clock();
  dVar17 = VNode::lower_bound(this->root_);
  (this->statistics_).initial_lb = dVar17;
  dVar17 = VNode::upper_bound(this->root_);
  (this->statistics_).initial_ub = dVar17;
  iVar5 = (*(this->model_->super_DSPOMDP)._vptr_DSPOMDP[0x18])();
  history = &(this->super_Solver).history_;
  do {
    pVVar7 = FindMaxApproxErrorLeaf(this->root_);
    bVar4 = VNode::IsLeaf(pVVar7);
    if (!bVar4) {
      __assert_fail("promising_node->IsLeaf()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/solver/aems.cpp"
                    ,0x24,"virtual ValuedAction despot::AEMS::Search()");
    }
    piVar2 = (this->super_Solver).history_.actions_.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    piVar3 = (this->super_Solver).history_.actions_.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    cVar9 = clock();
    Expand(pVVar7,this->lower_bound_,this->upper_bound_,this->model_,history);
    cVar10 = clock();
    (this->statistics_).time_node_expansion =
         (double)((cVar10 - cVar9) / 1000000) + (this->statistics_).time_node_expansion;
    Backup(pVVar7);
    History::Truncate(history,(int)((ulong)((long)piVar2 - (long)piVar3) >> 2));
    iVar6 = VNode::depth(pVVar7);
    if ((this->statistics_).longest_trial_length < iVar6) {
      iVar6 = VNode::depth(pVVar7);
      (this->statistics_).longest_trial_length = iVar6;
    }
    piVar1 = &(this->statistics_).num_trials;
    *piVar1 = *piVar1 + 1;
    piVar1 = &(this->statistics_).num_expanded_nodes;
    *piVar1 = *piVar1 + 1;
    cVar9 = clock();
    if (Globals::config <= (double)(cVar9 - cVar8) / 1000000.0) break;
    dVar17 = VNode::upper_bound(this->root_);
    dVar18 = VNode::lower_bound(this->root_);
  } while (1e-06 < dVar17 - dVar18);
  iVar6 = (*(this->model_->super_DSPOMDP)._vptr_DSPOMDP[0x18])();
  (this->statistics_).num_tree_particles = iVar6 - iVar5;
  iVar5 = VNode::Size(this->root_);
  (this->statistics_).num_tree_nodes = iVar5;
  iVar5 = VNode::PolicyTreeSize(this->root_);
  (this->statistics_).num_policy_nodes = iVar5;
  iVar5 = (*(this->model_->super_DSPOMDP)._vptr_DSPOMDP[0x18])();
  (this->statistics_).num_particles_after_search = iVar5;
  dVar17 = VNode::lower_bound(this->root_);
  (this->statistics_).final_lb = dVar17;
  dVar17 = VNode::upper_bound(this->root_);
  (this->statistics_).final_ub = dVar17;
  cVar9 = clock();
  (this->statistics_).time_search = (double)(cVar9 - cVar8) / 1000000.0;
  iVar5 = logging::level();
  if (0 < iVar5) {
    iVar5 = logging::level();
    if (2 < iVar5) {
      plVar11 = logging::stream(3);
      poVar12 = std::operator<<(&plVar11->super_ostream,"[AEMS::Search]");
      poVar12 = despot::operator<<(poVar12,&this->statistics_);
      std::endl<char,std::char_traits<char>>(poVar12);
    }
  }
  VVar19 = OptimalAction(this->root_);
  return VVar19;
}

Assistant:

ValuedAction AEMS::Search() {
	if (root_ == NULL) {
		root_ = new VNode(belief_->MakeCopy());
		InitLowerBound(root_, lower_bound_, history_);
		InitUpperBound(root_, upper_bound_, history_);
	}

	statistics_ = SearchStatistics();
	statistics_.num_particles_before_search = model_->NumActiveParticles();

	model_->PrintBelief(*belief_); //TODO: check and remove
	// cout << *belief_ << endl;
	clock_t begin = clock();
	statistics_.initial_lb = root_->lower_bound();
	statistics_.initial_ub = root_->upper_bound();

	int num_active_particles = model_->NumActiveParticles();
	do {
		VNode* promising_node = FindMaxApproxErrorLeaf(root_);
		assert(promising_node->IsLeaf());

		int hist_size = history_.Size();
		clock_t start = clock();
		Expand(promising_node, lower_bound_, upper_bound_, model_, history_);
		statistics_.time_node_expansion += (clock() - start) / CLOCKS_PER_SEC;
		Backup(promising_node);
		history_.Truncate(hist_size);

		if (promising_node->depth() > statistics_.longest_trial_length) {
			statistics_.longest_trial_length = promising_node->depth();
		}

		statistics_.num_trials++;
		statistics_.num_expanded_nodes++;
	} while ((double) (clock() - begin) / CLOCKS_PER_SEC
		< Globals::config.time_per_move
		&& (root_->upper_bound() - root_->lower_bound()) > 1e-6);

	statistics_.num_tree_particles = model_->NumActiveParticles()
		- num_active_particles;
	statistics_.num_tree_nodes = root_->Size();
	statistics_.num_policy_nodes = root_->PolicyTreeSize();
	statistics_.num_particles_after_search = model_->NumActiveParticles();

	statistics_.final_lb = root_->lower_bound();
	statistics_.final_ub = root_->upper_bound();
	statistics_.time_search = (double) (clock() - begin) / CLOCKS_PER_SEC;

	logi << "[AEMS::Search]" << statistics_ << endl;

	ValuedAction astar = OptimalAction(root_);
	//delete root_;
	return astar;
}